

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  Scene *pSVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  int iVar17;
  undefined4 uVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  vint4 bi;
  float fVar42;
  undefined1 auVar39 [32];
  vint4 ai;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar52;
  uint uVar55;
  uint uVar56;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong local_b88;
  ulong local_aa0;
  RTCFilterFunctionNArguments local_a90;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar70 = ZEXT1664(CONCAT412(fVar38,CONCAT48(fVar38,CONCAT44(fVar38,fVar38))));
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar43._4_4_ = fVar40;
  auVar43._0_4_ = fVar40;
  auVar43._8_4_ = fVar40;
  auVar43._12_4_ = fVar40;
  fVar38 = fVar38 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar45._4_4_ = fVar41;
  auVar45._0_4_ = fVar41;
  auVar45._8_4_ = fVar41;
  auVar45._12_4_ = fVar41;
  fVar40 = fVar40 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar41 = fVar41 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a10._8_4_ = 0x80000000;
  local_a10._0_8_ = 0x8000000080000000;
  local_a10._12_4_ = 0x80000000;
  auVar46._0_8_ = CONCAT44(fVar38,fVar38) ^ 0x8000000080000000;
  auVar46._8_4_ = -fVar38;
  auVar46._12_4_ = -fVar38;
  auVar49._0_8_ = CONCAT44(fVar40,fVar40) ^ 0x8000000080000000;
  auVar49._8_4_ = -fVar40;
  auVar49._12_4_ = -fVar40;
  auVar51._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
  auVar51._8_4_ = -fVar41;
  auVar51._12_4_ = -fVar41;
  iVar17 = (tray->tnear).field_0.i[k];
  auVar53._4_4_ = iVar17;
  auVar53._0_4_ = iVar17;
  auVar53._8_4_ = iVar17;
  auVar53._12_4_ = iVar17;
  iVar17 = (tray->tfar).field_0.i[k];
  auVar58._4_4_ = iVar17;
  auVar58._0_4_ = iVar17;
  auVar58._8_4_ = iVar17;
  auVar58._12_4_ = iVar17;
  iVar17 = 1 << ((uint)k & 0x1f);
  auVar35._4_4_ = iVar17;
  auVar35._0_4_ = iVar17;
  auVar35._8_4_ = iVar17;
  auVar35._12_4_ = iVar17;
  auVar35._16_4_ = iVar17;
  auVar35._20_4_ = iVar17;
  auVar35._24_4_ = iVar17;
  auVar35._28_4_ = iVar17;
  auVar5 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar35 = vpand_avx2(auVar35,auVar5);
  local_940 = vpcmpeqd_avx2(auVar35,auVar5);
  local_a20._8_4_ = 0x7fffffff;
  local_a20._0_8_ = 0x7fffffff7fffffff;
  local_a20._12_4_ = 0x7fffffff;
  puVar24 = local_7f8;
  do {
    puVar23 = puVar24;
    if (puVar23 == &local_800) break;
    puVar24 = puVar23 + -1;
    uVar27 = puVar23[-1];
    do {
      if ((uVar27 & 8) == 0) {
        uVar19 = uVar27 & 0xfffffffffffffff0;
        uVar18 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar31._4_4_ = uVar18;
        auVar31._0_4_ = uVar18;
        auVar31._8_4_ = uVar18;
        auVar31._12_4_ = uVar18;
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar22),auVar31,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar22));
        auVar32 = vfmadd213ps_fma(auVar32,auVar70._0_16_,auVar46);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar25),auVar31,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar25));
        auVar33 = vfmadd213ps_fma(auVar33,auVar43,auVar49);
        auVar32 = vpmaxsd_avx(auVar32,auVar33);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar26),auVar31,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar26));
        auVar33 = vfmadd213ps_fma(auVar33,auVar45,auVar51);
        auVar33 = vpmaxsd_avx(auVar33,auVar53);
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar22 ^ 0x10)),auVar31,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar22 ^ 0x10)));
        auVar32 = vpmaxsd_avx(auVar32,auVar33);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar25 ^ 0x10)),auVar31,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar25 ^ 0x10)));
        auVar54 = vfmadd213ps_fma(auVar54,auVar70._0_16_,auVar46);
        auVar33 = vfmadd213ps_fma(auVar33,auVar43,auVar49);
        auVar33 = vpminsd_avx(auVar54,auVar33);
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar26 ^ 0x10)),auVar31,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar26 ^ 0x10)));
        auVar54 = vfmadd213ps_fma(auVar54,auVar45,auVar51);
        auVar54 = vpminsd_avx(auVar54,auVar58);
        auVar33 = vpminsd_avx(auVar33,auVar54);
        if (((uint)uVar27 & 7) == 6) {
          auVar33 = vcmpps_avx(auVar32,auVar33,2);
          auVar32 = vcmpps_avx(*(undefined1 (*) [16])(uVar19 + 0xe0),auVar31,2);
          auVar54 = vcmpps_avx(auVar31,*(undefined1 (*) [16])(uVar19 + 0xf0),1);
          auVar32 = vandps_avx(auVar32,auVar54);
          auVar32 = vandps_avx(auVar32,auVar33);
        }
        else {
          auVar32 = vcmpps_avx(auVar32,auVar33,2);
        }
        auVar32 = vpslld_avx(auVar32,0x1f);
        uVar18 = vmovmskps_avx(auVar32);
        local_aa0 = CONCAT44((int)(uVar19 >> 0x20),uVar18);
      }
      if ((uVar27 & 8) == 0) {
        if (local_aa0 == 0) {
          uVar52 = 4;
        }
        else {
          uVar19 = uVar27 & 0xfffffffffffffff0;
          lVar28 = 0;
          for (uVar27 = local_aa0; uVar20 = local_aa0, (uVar27 & 1) == 0;
              uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          while( true ) {
            uVar20 = uVar20 - 1 & uVar20;
            uVar27 = *(ulong *)(uVar19 + lVar28 * 8);
            if (uVar20 == 0) break;
            *puVar24 = uVar27;
            puVar24 = puVar24 + 1;
            lVar28 = 0;
            for (uVar27 = uVar20; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
          }
          uVar52 = 0;
        }
      }
      else {
        uVar52 = 6;
      }
    } while (uVar52 == 0);
    if (uVar52 == 6) {
      uVar19 = (ulong)((uint)uVar27 & 0xf);
      uVar52 = 0;
      uVar20 = uVar19 - 8;
      bVar29 = uVar19 != 8;
      if (bVar29) {
        uVar27 = uVar27 & 0xfffffffffffffff0;
        uVar19 = 0;
        do {
          lVar28 = uVar19 * 0x140;
          uVar18 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar33._4_4_ = uVar18;
          auVar33._0_4_ = uVar18;
          auVar33._8_4_ = uVar18;
          auVar33._12_4_ = uVar18;
          auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x90 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + lVar28));
          auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xa0 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x10 + lVar28));
          auVar7 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xb0 + lVar28),auVar33,
                                   *(undefined1 (*) [16])(uVar27 + 0x20 + lVar28));
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xc0 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x30 + lVar28));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xd0 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x40 + lVar28));
          auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xe0 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x50 + lVar28));
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0xf0 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x60 + lVar28));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x100 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x70 + lVar28));
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar27 + 0x110 + lVar28),auVar33,
                                    *(undefined1 (*) [16])(uVar27 + 0x80 + lVar28));
          auVar33 = vsubps_avx(auVar48,auVar32);
          auVar32 = vsubps_avx(auVar37,auVar54);
          auVar54 = vsubps_avx(auVar7,auVar31);
          auVar31 = vsubps_avx(auVar61,auVar48);
          auVar61 = vsubps_avx(auVar44,auVar37);
          auVar44 = vsubps_avx(auVar34,auVar7);
          auVar34._0_4_ = auVar32._0_4_ * auVar44._0_4_;
          auVar34._4_4_ = auVar32._4_4_ * auVar44._4_4_;
          auVar34._8_4_ = auVar32._8_4_ * auVar44._8_4_;
          auVar34._12_4_ = auVar32._12_4_ * auVar44._12_4_;
          local_970 = vfmsub231ps_fma(auVar34,auVar61,auVar54);
          auVar36._0_4_ = auVar54._0_4_ * auVar31._0_4_;
          auVar36._4_4_ = auVar54._4_4_ * auVar31._4_4_;
          auVar36._8_4_ = auVar54._8_4_ * auVar31._8_4_;
          auVar36._12_4_ = auVar54._12_4_ * auVar31._12_4_;
          local_960 = vfmsub231ps_fma(auVar36,auVar44,auVar33);
          uVar18 = *(undefined4 *)(ray + k * 4);
          auVar62._4_4_ = uVar18;
          auVar62._0_4_ = uVar18;
          auVar62._8_4_ = uVar18;
          auVar62._12_4_ = uVar18;
          uVar18 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar64._4_4_ = uVar18;
          auVar64._0_4_ = uVar18;
          auVar64._8_4_ = uVar18;
          auVar64._12_4_ = uVar18;
          uVar18 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar67._4_4_ = uVar18;
          auVar67._0_4_ = uVar18;
          auVar67._8_4_ = uVar18;
          auVar67._12_4_ = uVar18;
          fVar38 = *(float *)(ray + k * 4 + 0x80);
          auVar59._4_4_ = fVar38;
          auVar59._0_4_ = fVar38;
          auVar59._8_4_ = fVar38;
          auVar59._12_4_ = fVar38;
          auVar48 = vsubps_avx(auVar48,auVar62);
          fVar40 = *(float *)(ray + k * 4 + 0xa0);
          auVar63._4_4_ = fVar40;
          auVar63._0_4_ = fVar40;
          auVar63._8_4_ = fVar40;
          auVar63._12_4_ = fVar40;
          auVar37 = vsubps_avx(auVar37,auVar64);
          fVar41 = *(float *)(ray + k * 4 + 0xc0);
          auVar65._4_4_ = fVar41;
          auVar65._0_4_ = fVar41;
          auVar65._8_4_ = fVar41;
          auVar65._12_4_ = fVar41;
          auVar7 = vsubps_avx(auVar7,auVar67);
          auVar68._0_4_ = fVar38 * auVar37._0_4_;
          auVar68._4_4_ = fVar38 * auVar37._4_4_;
          auVar68._8_4_ = fVar38 * auVar37._8_4_;
          auVar68._12_4_ = fVar38 * auVar37._12_4_;
          auVar34 = vfmsub231ps_fma(auVar68,auVar48,auVar63);
          auVar60._0_4_ = auVar44._0_4_ * auVar34._0_4_;
          auVar60._4_4_ = auVar44._4_4_ * auVar34._4_4_;
          auVar60._8_4_ = auVar44._8_4_ * auVar34._8_4_;
          auVar60._12_4_ = auVar44._12_4_ * auVar34._12_4_;
          auVar69._0_4_ = auVar54._0_4_ * auVar34._0_4_;
          auVar69._4_4_ = auVar54._4_4_ * auVar34._4_4_;
          auVar69._8_4_ = auVar54._8_4_ * auVar34._8_4_;
          auVar69._12_4_ = auVar54._12_4_ * auVar34._12_4_;
          auVar54._0_4_ = fVar41 * auVar48._0_4_;
          auVar54._4_4_ = fVar41 * auVar48._4_4_;
          auVar54._8_4_ = fVar41 * auVar48._8_4_;
          auVar54._12_4_ = fVar41 * auVar48._12_4_;
          auVar44 = vfmsub231ps_fma(auVar54,auVar7,auVar59);
          auVar54 = vfmadd231ps_fma(auVar60,auVar44,auVar61);
          auVar44 = vfmadd231ps_fma(auVar69,auVar32,auVar44);
          auVar50._0_4_ = auVar33._0_4_ * auVar61._0_4_;
          auVar50._4_4_ = auVar33._4_4_ * auVar61._4_4_;
          auVar50._8_4_ = auVar33._8_4_ * auVar61._8_4_;
          auVar50._12_4_ = auVar33._12_4_ * auVar61._12_4_;
          local_950 = vfmsub231ps_fma(auVar50,auVar31,auVar32);
          auVar32._0_4_ = fVar40 * auVar7._0_4_;
          auVar32._4_4_ = fVar40 * auVar7._4_4_;
          auVar32._8_4_ = fVar40 * auVar7._8_4_;
          auVar32._12_4_ = fVar40 * auVar7._12_4_;
          auVar34 = vfmsub231ps_fma(auVar32,auVar37,auVar65);
          auVar66._0_4_ = fVar41 * local_950._0_4_;
          auVar66._4_4_ = fVar41 * local_950._4_4_;
          auVar66._8_4_ = fVar41 * local_950._8_4_;
          auVar66._12_4_ = fVar41 * local_950._12_4_;
          auVar32 = vfmadd231ps_fma(auVar66,local_960,auVar63);
          auVar61 = vfmadd231ps_fma(auVar32,local_970,auVar59);
          auVar54 = vfmadd231ps_fma(auVar54,auVar34,auVar31);
          auVar32 = vandps_avx(auVar61,local_a10);
          uVar52 = auVar32._0_4_;
          local_a00._0_4_ = (float)(uVar52 ^ auVar54._0_4_);
          uVar55 = auVar32._4_4_;
          local_a00._4_4_ = (float)(uVar55 ^ auVar54._4_4_);
          uVar56 = auVar32._8_4_;
          local_a00._8_4_ = (float)(uVar56 ^ auVar54._8_4_);
          uVar57 = auVar32._12_4_;
          local_a00._12_4_ = (float)(uVar57 ^ auVar54._12_4_);
          auVar32 = vfmadd231ps_fma(auVar44,auVar33,auVar34);
          local_9f0._0_4_ = (float)(uVar52 ^ auVar32._0_4_);
          local_9f0._4_4_ = (float)(uVar55 ^ auVar32._4_4_);
          local_9f0._8_4_ = (float)(uVar56 ^ auVar32._8_4_);
          local_9f0._12_4_ = (float)(uVar57 ^ auVar32._12_4_);
          auVar54 = ZEXT816(0) << 0x20;
          auVar32 = vcmpps_avx(local_a00,auVar54,5);
          auVar33 = vcmpps_avx(local_9f0,auVar54,5);
          auVar32 = vandps_avx(auVar33,auVar32);
          local_9d0 = vandps_avx(auVar61,local_a20);
          auVar33 = vcmpps_avx(auVar61,auVar54,4);
          auVar32 = vandps_avx(auVar32,auVar33);
          auVar61._0_4_ = local_9f0._0_4_ + local_a00._0_4_;
          auVar61._4_4_ = local_9f0._4_4_ + local_a00._4_4_;
          auVar61._8_4_ = local_9f0._8_4_ + local_a00._8_4_;
          auVar61._12_4_ = local_9f0._12_4_ + local_a00._12_4_;
          auVar33 = vcmpps_avx(auVar61,local_9d0,2);
          auVar54 = auVar33 & auVar32;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar32 = vandps_avx(auVar32,auVar33);
            auVar47._0_4_ = local_950._0_4_ * auVar7._0_4_;
            auVar47._4_4_ = local_950._4_4_ * auVar7._4_4_;
            auVar47._8_4_ = local_950._8_4_ * auVar7._8_4_;
            auVar47._12_4_ = local_950._12_4_ * auVar7._12_4_;
            auVar33 = vfmadd213ps_fma(auVar37,local_960,auVar47);
            auVar33 = vfmadd213ps_fma(auVar48,local_970,auVar33);
            local_9e0._0_4_ = (float)(uVar52 ^ auVar33._0_4_);
            local_9e0._4_4_ = (float)(uVar55 ^ auVar33._4_4_);
            local_9e0._8_4_ = (float)(uVar56 ^ auVar33._8_4_);
            local_9e0._12_4_ = (float)(uVar57 ^ auVar33._12_4_);
            fVar38 = *(float *)(ray + k * 4 + 0x60);
            auVar44._0_4_ = local_9d0._0_4_ * fVar38;
            auVar44._4_4_ = local_9d0._4_4_ * fVar38;
            auVar44._8_4_ = local_9d0._8_4_ * fVar38;
            auVar44._12_4_ = local_9d0._12_4_ * fVar38;
            auVar33 = vcmpps_avx(auVar44,local_9e0,1);
            fVar38 = *(float *)(ray + k * 4 + 0x100);
            auVar48._0_4_ = local_9d0._0_4_ * fVar38;
            auVar48._4_4_ = local_9d0._4_4_ * fVar38;
            auVar48._8_4_ = local_9d0._8_4_ * fVar38;
            auVar48._12_4_ = local_9d0._12_4_ * fVar38;
            auVar54 = vcmpps_avx(local_9e0,auVar48,2);
            auVar33 = vandps_avx(auVar33,auVar54);
            auVar54 = auVar32 & auVar33;
            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar54[0xf] < '\0') {
              local_9b0 = vandps_avx(auVar32,auVar33);
              pSVar2 = context->scene;
              auVar32 = vrcpps_avx(local_9d0);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = &DAT_3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar33 = vfnmadd213ps_fma(local_9d0,auVar32,auVar37);
              auVar32 = vfmadd132ps_fma(auVar33,auVar32,auVar32);
              fVar38 = auVar32._0_4_;
              fVar40 = auVar32._4_4_;
              fVar41 = auVar32._8_4_;
              fVar42 = auVar32._12_4_;
              local_980[0] = fVar38 * local_9e0._0_4_;
              local_980[1] = fVar40 * local_9e0._4_4_;
              local_980[2] = fVar41 * local_9e0._8_4_;
              local_980[3] = fVar42 * local_9e0._12_4_;
              local_9a0[0] = fVar38 * local_a00._0_4_;
              local_9a0[1] = fVar40 * local_a00._4_4_;
              local_9a0[2] = fVar41 * local_a00._8_4_;
              local_9a0[3] = fVar42 * local_a00._12_4_;
              local_990._0_4_ = fVar38 * local_9f0._0_4_;
              local_990._4_4_ = fVar40 * local_9f0._4_4_;
              local_990._8_4_ = fVar41 * local_9f0._8_4_;
              local_990._12_4_ = fVar42 * local_9f0._12_4_;
              uVar18 = vmovmskps_avx(local_9b0);
              local_b88 = CONCAT44((int)((ulong)pSVar2 >> 0x20),uVar18);
              do {
                local_a30 = auVar70._0_16_;
                uVar6 = 0;
                for (uVar21 = local_b88; (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  uVar6 = uVar6 + 1;
                }
                uVar52 = *(uint *)(lVar28 + uVar27 + 0x120 + uVar6 * 4);
                pGVar3 = (pSVar2->geometries).items[uVar52].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  local_b88 = local_b88 ^ 1L << (uVar6 & 0x3f);
                  bVar30 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar30 = false;
                }
                else {
                  uVar21 = (ulong)(uint)((int)uVar6 * 4);
                  uVar18 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar1 = *(undefined4 *)((long)local_9a0 + uVar21);
                  local_8c0._4_4_ = uVar1;
                  local_8c0._0_4_ = uVar1;
                  local_8c0._8_4_ = uVar1;
                  local_8c0._12_4_ = uVar1;
                  local_8c0._16_4_ = uVar1;
                  local_8c0._20_4_ = uVar1;
                  local_8c0._24_4_ = uVar1;
                  local_8c0._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_990 + uVar21);
                  local_8a0._4_4_ = uVar1;
                  local_8a0._0_4_ = uVar1;
                  local_8a0._8_4_ = uVar1;
                  local_8a0._12_4_ = uVar1;
                  local_8a0._16_4_ = uVar1;
                  local_8a0._20_4_ = uVar1;
                  local_8a0._24_4_ = uVar1;
                  local_8a0._28_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar21);
                  local_a90.context = context->user;
                  uVar1 = *(undefined4 *)(lVar28 + uVar27 + 0x130 + uVar21);
                  local_880._4_4_ = uVar1;
                  local_880._0_4_ = uVar1;
                  local_880._8_4_ = uVar1;
                  local_880._12_4_ = uVar1;
                  local_880._16_4_ = uVar1;
                  local_880._20_4_ = uVar1;
                  local_880._24_4_ = uVar1;
                  local_880._28_4_ = uVar1;
                  local_920 = *(undefined4 *)(local_970 + uVar21);
                  local_900 = *(undefined4 *)(local_960 + uVar21);
                  local_8e0 = *(undefined4 *)(local_950 + uVar21);
                  local_860._4_4_ = uVar52;
                  local_860._0_4_ = uVar52;
                  local_860._8_4_ = uVar52;
                  local_860._12_4_ = uVar52;
                  local_860._16_4_ = uVar52;
                  local_860._20_4_ = uVar52;
                  local_860._24_4_ = uVar52;
                  local_860._28_4_ = uVar52;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  vpcmpeqd_avx2(local_8c0,local_8c0);
                  uStack_83c = (local_a90.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_a90.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_a60 = local_940._0_8_;
                  uStack_a58 = local_940._8_8_;
                  uStack_a50 = local_940._16_8_;
                  uStack_a48 = local_940._24_8_;
                  local_a90.valid = (int *)&local_a60;
                  local_a90.geometryUserPtr = pGVar3->userPtr;
                  local_a90.hit = (RTCHitN *)&local_920;
                  local_a90.N = 8;
                  local_a90.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_a90);
                  }
                  auVar5._8_8_ = uStack_a58;
                  auVar5._0_8_ = local_a60;
                  auVar5._16_8_ = uStack_a50;
                  auVar5._24_8_ = uStack_a48;
                  auVar5 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar5);
                  auVar35 = _DAT_0205a980 & ~auVar5;
                  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar35 >> 0x7f,0) == '\0') &&
                        (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar35 >> 0xbf,0) == '\0') &&
                      (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar35[0x1f]) {
                    auVar5 = auVar5 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_a90);
                    }
                    auVar16._8_8_ = uStack_a58;
                    auVar16._0_8_ = local_a60;
                    auVar16._16_8_ = uStack_a50;
                    auVar16._24_8_ = uStack_a48;
                    auVar35 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16);
                    auVar5 = auVar35 ^ _DAT_0205a980;
                    auVar39._8_4_ = 0xff800000;
                    auVar39._0_8_ = 0xff800000ff800000;
                    auVar39._12_4_ = 0xff800000;
                    auVar39._16_4_ = 0xff800000;
                    auVar39._20_4_ = 0xff800000;
                    auVar39._24_4_ = 0xff800000;
                    auVar39._28_4_ = 0xff800000;
                    auVar35 = vblendvps_avx(auVar39,*(undefined1 (*) [32])(local_a90.ray + 0x100),
                                            auVar35);
                    *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar35;
                  }
                  bVar14 = (auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar15 = (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar13 = (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar12 = SUB321(auVar5 >> 0x7f,0) == '\0';
                  bVar11 = (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar10 = SUB321(auVar5 >> 0xbf,0) == '\0';
                  bVar9 = (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar8 = -1 < auVar5[0x1f];
                  bVar30 = ((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) &&
                           bVar9) && bVar8;
                  if (((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) && bVar9)
                      && bVar8) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar18;
                    local_b88 = local_b88 ^ 1L << (uVar6 & 0x3f);
                  }
                  auVar70 = ZEXT1664(local_a30);
                }
                uVar52 = 0;
                if (!bVar30) {
                  if (bVar29) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar52 = 1;
                  }
                  goto LAB_005e13ac;
                }
              } while (local_b88 != 0);
            }
          }
          uVar52 = 0;
          uVar19 = uVar19 + 1;
          bVar29 = uVar19 < uVar20;
        } while (uVar19 != uVar20);
      }
    }
LAB_005e13ac:
  } while ((uVar52 & 3) == 0);
  return puVar23 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }